

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.c
# Opt level: O0

double p_strtod(pchar *str)

{
  bool bVar1;
  pchar *mem;
  ushort **ppuVar2;
  char *pcVar3;
  double local_60;
  char *local_50;
  pchar *strp;
  pchar *orig_str;
  pint frac;
  puint expon;
  double pow10;
  double scale;
  double value;
  double sign;
  pchar *str_local;
  
  mem = p_strchomp(str);
  if (mem == (pchar *)0x0) {
    str_local = (pchar *)0x0;
  }
  else {
    value = 1.0;
    if (*mem == '-') {
      value = -1.0;
      local_50 = mem + 1;
    }
    else {
      local_50 = mem;
      if (*mem == '+') {
        local_50 = mem + 1;
      }
    }
    scale = 0.0;
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_50] & 0x800) != 0) {
      scale = scale * 10.0 + (double)(*local_50 + -0x30);
      local_50 = local_50 + 1;
    }
    if (*local_50 == '.') {
      _frac = 10.0;
      while( true ) {
        local_50 = local_50 + 1;
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)*local_50] & 0x800) == 0) break;
        scale = (double)(*local_50 + -0x30) / _frac + scale;
        _frac = _frac * 10.0;
      }
    }
    bVar1 = false;
    pow10 = 1.0;
    if ((*local_50 == 'e') || (*local_50 == 'E')) {
      pcVar3 = local_50 + 1;
      if (*pcVar3 == '-') {
        bVar1 = true;
        pcVar3 = local_50 + 2;
      }
      else if (*pcVar3 == '+') {
        pcVar3 = local_50 + 2;
      }
      local_50 = pcVar3;
      orig_str._4_4_ = 0;
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_50] & 0x800) != 0) {
        orig_str._4_4_ = orig_str._4_4_ * 10 + *local_50 + -0x30;
        local_50 = local_50 + 1;
      }
      if (0x134 < orig_str._4_4_) {
        orig_str._4_4_ = 0x134;
      }
      for (; 0x31 < orig_str._4_4_; orig_str._4_4_ = orig_str._4_4_ - 0x32) {
        pow10 = pow10 * 1e+50;
      }
      for (; 7 < orig_str._4_4_; orig_str._4_4_ = orig_str._4_4_ - 8) {
        pow10 = pow10 * 100000000.0;
      }
      for (; orig_str._4_4_ != 0; orig_str._4_4_ = orig_str._4_4_ - 1) {
        pow10 = pow10 * 10.0;
      }
    }
    p_free(mem);
    if (bVar1) {
      local_60 = scale / pow10;
    }
    else {
      local_60 = scale * pow10;
    }
    str_local = (pchar *)(value * local_60);
  }
  return (double)str_local;
}

Assistant:

P_LIB_API double
p_strtod (const pchar *str)
{
	double		sign;
	double		value;
	double		scale;
	double		pow10;
	puint		expon;
	pint		frac;
	pchar		*orig_str;
	const pchar	*strp;

	orig_str = p_strchomp (str);

	if (P_UNLIKELY (orig_str == NULL))
		return 0.0;

	strp = orig_str;
	sign = 1.0;

	if (*strp == '-') {
		sign = -1.0;
		strp += 1;
	} else if (*strp == '+')
		strp += 1;

	/* Get digits before decimal point or exponent, if any */
	for (value = 0.0; isdigit ((pint) *strp); strp += 1)
		value = value * 10.0 + (*strp - '0');

	/* Get digits after decimal point, if any */
	if (*strp == '.') {
		pow10 = 10.0;
		strp += 1;

		while (isdigit ((pint) *strp)) {
			value += (*strp - '0') / pow10;
			pow10 *= 10.0;
			strp += 1;
		}
	}

	/* Handle exponent, if any */
	frac  = 0;
	scale = 1.0;

	if ((*strp == 'e') || (*strp == 'E')) {
		/* Get sign of exponent, if any */
		strp += 1;

		if (*strp == '-') {
			frac = 1;
			strp += 1;

		} else if (*strp == '+')
			strp += 1;

		/* Get digits of exponent, if any */
		for (expon = 0; isdigit ((pint) *strp); strp += 1)
			expon = expon * 10 + (puint) (*strp - '0');

		if (P_UNLIKELY (expon > P_STR_MAX_EXPON))
			expon = P_STR_MAX_EXPON;

		/* Calculate scaling factor */
		while (expon >= 50) {
			scale *= 1e50;
			expon -= 50;
		}

		while (expon >= 8) {
			scale *= 1e8;
			expon -= 8;
		}

		while (expon > 0) {
			scale *= 10.0;
			expon -= 1;
		}
	}

	p_free (orig_str);

	/* Return signed and scaled floating point result */
	return sign * (frac ? (value / scale) : (value * scale));
}